

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op_keepdims<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  size_t sVar1;
  void *pvVar2;
  bool bVar3;
  int i_1;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int q;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint _w;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  float fVar15;
  int local_e0;
  int local_d0;
  Mat sums;
  Mat local_78;
  
  sVar1 = a->elemsize;
  iVar8 = a->dims;
  if (iVar8 == 3) {
    uVar7 = a->w;
    lVar9 = (long)(int)uVar7;
    uVar13 = a->h;
    _w = a->c;
    uVar12 = uVar13 * uVar7;
    bVar3 = !reduce_h;
    if ((reduce_w && !bVar3) && reduce_c) {
      Mat::create(b,1,1,1,sVar1,opt->blob_allocator);
      Mat::Mat(&sums,_w,sVar1,opt->workspace_allocator);
      local_e0 = -100;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        uVar5 = 0;
        uVar14 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar14 = uVar5;
        }
        uVar10 = (ulong)_w;
        if ((int)_w < 1) {
          uVar10 = uVar5;
        }
        for (; uVar5 != uVar10; uVar5 = uVar5 + 1) {
          Mat::channel(&local_78,a,(int)uVar5);
          pvVar4 = local_78.data;
          Mat::~Mat(&local_78);
          fVar15 = 0.0;
          for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
            fVar15 = fVar15 + *(float *)((long)pvVar4 + uVar11 * 4);
          }
          *(float *)((long)sums.data + uVar5 * 4) = fVar15;
        }
        fVar15 = 0.0;
        for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
          fVar15 = fVar15 + *(float *)((long)sums.data + uVar14 * 4);
        }
        *(float *)b->data = fVar15;
        local_e0 = 0;
      }
    }
    else {
      if ((reduce_w && !bVar3) && !reduce_c) {
        Mat::create(b,1,1,_w,sVar1,opt->blob_allocator);
        if ((int)uVar12 < 1) {
          uVar12 = 0;
        }
        if ((int)_w < 1) {
          _w = 0;
        }
        for (uVar7 = 0; uVar7 != _w; uVar7 = uVar7 + 1) {
          Mat::channel(&sums,a,uVar7);
          pvVar4 = sums.data;
          Mat::~Mat(&sums);
          Mat::channel(&sums,b,uVar7);
          pvVar2 = sums.data;
          Mat::~Mat(&sums);
          fVar15 = 0.0;
          for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
            fVar15 = fVar15 + *(float *)((long)pvVar4 + uVar14 * 4);
          }
          *(float *)pvVar2 = fVar15;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && !reduce_c) {
        Mat::create(b,1,uVar13,_w,sVar1,opt->blob_allocator);
        uVar14 = 0;
        if (0 < (int)uVar7) {
          uVar14 = (ulong)uVar7;
        }
        uVar5 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar5 = 0;
        }
        uVar10 = (ulong)_w;
        if ((int)_w < 1) {
          uVar10 = 0;
        }
        for (iVar8 = 0; local_d0 = (int)uVar10, iVar8 != local_d0; iVar8 = iVar8 + 1) {
          Mat::channel(&sums,a,iVar8);
          pvVar4 = sums.data;
          Mat::~Mat(&sums);
          Mat::channel(&sums,b,iVar8);
          pvVar2 = sums.data;
          Mat::~Mat(&sums);
          for (uVar11 = 0; uVar11 != uVar5; uVar11 = uVar11 + 1) {
            fVar15 = 0.0;
            for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
              fVar15 = fVar15 + *(float *)((long)pvVar4 + uVar6 * 4);
            }
            *(float *)((long)pvVar2 + uVar11 * 4) = fVar15;
            pvVar4 = (void *)((long)pvVar4 + lVar9 * 4);
          }
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && reduce_c) {
        Mat::create(b,1,uVar13,1,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,1,uVar13,_w,sVar1,opt->workspace_allocator);
        local_e0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar12 = 0;
          uVar14 = 0;
          if (0 < (int)uVar7) {
            uVar14 = (ulong)uVar7;
          }
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (; uVar12 != _w; uVar12 = uVar12 + 1) {
            Mat::channel(&local_78,a,uVar12);
            pvVar4 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&sums,uVar12);
            pvVar2 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar5 = 0; uVar5 != uVar13; uVar5 = uVar5 + 1) {
              fVar15 = 0.0;
              for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
                fVar15 = fVar15 + *(float *)((long)pvVar4 + uVar10 * 4);
              }
              *(float *)((long)pvVar2 + uVar5 * 4) = fVar15;
              pvVar4 = (void *)((long)pvVar4 + lVar9 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_e0 = 0;
          for (uVar7 = 0; uVar7 != _w; uVar7 = uVar7 + 1) {
            Mat::channel(&local_78,&sums,uVar7);
            pvVar2 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar4 = b->data;
            for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
              *(float *)((long)pvVar4 + uVar14 * 4) =
                   *(float *)((long)pvVar2 + uVar14 * 4) + *(float *)((long)pvVar4 + uVar14 * 4);
            }
          }
        }
      }
      else {
        if ((bVar3 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar7,uVar13,1,sVar1,opt->blob_allocator);
            Mat::fill(b,0.0);
            uVar14 = (ulong)uVar12;
            if ((int)uVar12 < 1) {
              uVar14 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar7 = 0; uVar7 != _w; uVar7 = uVar7 + 1) {
              Mat::channel(&sums,a,uVar7);
              pvVar2 = sums.data;
              Mat::~Mat(&sums);
              pvVar4 = b->data;
              for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar4 + uVar5 * 4) =
                     *(float *)((long)pvVar2 + uVar5 * 4) + *(float *)((long)pvVar4 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((bVar3 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar7,1,_w,sVar1,opt->blob_allocator);
          Mat::fill(b,0.0);
          uVar14 = 0;
          if (0 < (int)uVar7) {
            uVar14 = (ulong)uVar7;
          }
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (uVar7 = 0; uVar7 != _w; uVar7 = uVar7 + 1) {
            Mat::channel(&sums,a,uVar7);
            pvVar4 = sums.data;
            Mat::~Mat(&sums);
            Mat::channel(&sums,b,uVar7);
            pvVar2 = sums.data;
            Mat::~Mat(&sums);
            for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
              for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar2 + uVar5 * 4) =
                     *(float *)((long)pvVar4 + uVar5 * 4) + *(float *)((long)pvVar2 + uVar5 * 4);
              }
              pvVar4 = (void *)((long)pvVar4 + lVar9 * 4);
            }
          }
          return 0;
        }
        Mat::create(b,uVar7,1,1,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,uVar7,1,_w,sVar1,opt->workspace_allocator);
        local_e0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar12 = 0;
          uVar14 = 0;
          if (0 < (int)uVar7) {
            uVar14 = (ulong)uVar7;
          }
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (; uVar12 != _w; uVar12 = uVar12 + 1) {
            Mat::channel(&local_78,a,uVar12);
            pvVar4 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&sums,uVar12);
            pvVar2 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar7 = 0; uVar7 != uVar13; uVar7 = uVar7 + 1) {
              for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar2 + uVar5 * 4) =
                     *(float *)((long)pvVar4 + uVar5 * 4) + *(float *)((long)pvVar2 + uVar5 * 4);
              }
              pvVar4 = (void *)((long)pvVar4 + lVar9 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_e0 = 0;
          for (uVar7 = 0; uVar7 != _w; uVar7 = uVar7 + 1) {
            Mat::channel(&local_78,&sums,uVar7);
            pvVar2 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar4 = b->data;
            for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar4 + uVar5 * 4) =
                   *(float *)((long)pvVar2 + uVar5 * 4) + *(float *)((long)pvVar4 + uVar5 * 4);
            }
          }
        }
      }
    }
LAB_001e39b5:
    Mat::~Mat(&sums);
  }
  else {
    if (iVar8 == 2) {
      uVar7 = a->w;
      uVar13 = a->h;
      if (reduce_w && reduce_h) {
        Mat::create(b,1,1,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,uVar13,sVar1,opt->workspace_allocator);
        local_e0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          iVar8 = a->w;
          sVar1 = a->elemsize;
          uVar5 = 0;
          uVar14 = (ulong)uVar7;
          if ((int)uVar7 < 1) {
            uVar14 = uVar5;
          }
          pvVar4 = a->data;
          uVar10 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar10 = uVar5;
          }
          for (; fVar15 = 0.0, uVar5 != uVar10; uVar5 = uVar5 + 1) {
            for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
              fVar15 = fVar15 + *(float *)((long)pvVar4 + uVar11 * 4);
            }
            *(float *)((long)sums.data + uVar5 * 4) = fVar15;
            pvVar4 = (void *)((long)pvVar4 + (long)iVar8 * sVar1);
          }
          for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
            fVar15 = fVar15 + *(float *)((long)sums.data + uVar14 * 4);
          }
          *(float *)b->data = fVar15;
          local_e0 = 0;
        }
        goto LAB_001e39b5;
      }
      if (reduce_w && !reduce_h) {
        Mat::create(b,1,uVar13,sVar1,opt->blob_allocator);
        pvVar4 = a->data;
        iVar8 = a->w;
        sVar1 = a->elemsize;
        pvVar2 = b->data;
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        uVar14 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar14 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar14; uVar5 = uVar5 + 1) {
          fVar15 = 0.0;
          for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
            fVar15 = fVar15 + *(float *)((long)pvVar4 + uVar10 * 4);
          }
          *(float *)((long)pvVar2 + uVar5 * 4) = fVar15;
          pvVar4 = (void *)((long)pvVar4 + (long)iVar8 * sVar1);
        }
      }
      else {
        if (!reduce_h || reduce_w) {
          return 0;
        }
        Mat::create(b,uVar7,1,sVar1,opt->blob_allocator);
        Mat::fill(b,0.0);
        pvVar4 = a->data;
        iVar8 = a->w;
        sVar1 = a->elemsize;
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        uVar14 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar14 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar14; uVar5 = uVar5 + 1) {
          pvVar2 = b->data;
          for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar2 + uVar10 * 4) =
                 *(float *)((long)pvVar4 + uVar10 * 4) + *(float *)((long)pvVar2 + uVar10 * 4);
          }
          pvVar4 = (void *)((long)pvVar4 + (long)iVar8 * sVar1);
        }
      }
    }
    else {
      if (iVar8 != 1) {
        return 0;
      }
      uVar7 = a->w;
      Mat::create(b,1,sVar1,opt->blob_allocator);
      uVar5 = 0;
      uVar14 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar14 = uVar5;
      }
      fVar15 = 0.0;
      for (; uVar14 != uVar5; uVar5 = uVar5 + 1) {
        fVar15 = fVar15 + *(float *)((long)a->data + uVar5 * 4);
      }
      *(float *)b->data = fVar15;
    }
    local_e0 = 0;
  }
  return local_e0;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}